

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *vec)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  type_conflict5 tVar7;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar8;
  int iVar9;
  long lVar10;
  int *piVar11;
  bool bVar12;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pnVar3 = (this->l).rval.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar4 = (this->l).ridx;
  piVar5 = (this->l).rbeg;
  piVar6 = (this->l).rorig;
  lVar8 = (long)this->thedim;
  while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
    lVar10 = (long)piVar6[lVar8];
    local_a8.data._M_elems._32_8_ = *(undefined8 *)(vec[lVar10].m_backend.data._M_elems + 8);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)vec[lVar10].m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)(vec[lVar10].m_backend.data._M_elems + 2);
    puVar1 = vec[lVar10].m_backend.data._M_elems + 4;
    local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_a8.exp = vec[lVar10].m_backend.exp;
    local_a8.neg = vec[lVar10].m_backend.neg;
    local_a8.fpclass = vec[lVar10].m_backend.fpclass;
    local_a8.prec_elem = vec[lVar10].m_backend.prec_elem;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    tVar7 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_a8,(double *)&local_68);
    if (tVar7) {
      iVar2 = piVar5[lVar10];
      piVar11 = piVar4 + iVar2;
      v = &pnVar3[iVar2].m_backend;
      for (iVar9 = piVar5[lVar10 + 1] - iVar2; 0 < iVar9; iVar9 = iVar9 + -1) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,&local_a8,v);
        iVar2 = *piVar11;
        piVar11 = piVar11 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&vec[iVar2].m_backend,&local_68);
        v = v + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftNoNZ(R* vec)
{
   int i, j, k;
   int r;
   R x;
   R* rval, *val;
   int* ridx, *idx;
   int* rbeg;
   int* rorig;

   ridx = l.ridx;
   rval = l.rval.data();
   rbeg = l.rbeg;
   rorig = l.rorig;

#ifndef SOPLEX_WITH_L_ROWS
   R* lval = l.val.data();
   int*    lidx = l.idx;
   int*    lrow = l.row;
   int*    lbeg = l.start;

   i = l.firstUpdate - 1;
   assert(i < thedim);

   for(; i >= 0; --i)
   {
      k = lbeg[i];
      assert(k >= 0 && k < l.size);
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(j = lbeg[i + 1]; j > k; --j)
      {
         assert(*idx >= 0 && *idx < thedim);
         x += vec[*idx++] * (*val++);
      }

      vec[lrow[i]] -= x;
   }

#else

   for(i = thedim; i--;)
   {
      r = rorig[i];
      x = vec[r];

      if(x != 0.0)
      {
         k = rbeg[r];
         j = rbeg[r + 1] - k;
         val = &rval[k];
         idx = &ridx[k];

         while(j-- > 0)
         {
            assert(l.rperm[*idx] < i);
            vec[*idx++] -= x * *val++;
         }
      }
   }

#endif
}